

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlfparser.h
# Opt level: O3

vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *
xlfparser::tokenize<char>
          (vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *__return_storage_ptr__,
          char *formula,size_t size,Options<char> *options)

{
  vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *pvVar1;
  Options<char> *options_00;
  pointer pTVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  ostream *poVar6;
  size_t sVar7;
  long lVar8;
  _Elt_pointer pTVar9;
  runtime_error *prVar10;
  char cVar11;
  undefined **ppuVar12;
  char *pcVar13;
  pointer pTVar14;
  pointer pTVar15;
  char cVar16;
  long *plVar17;
  char *pcVar18;
  pointer pTVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *tokens;
  stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
  stack;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> sn_regex;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> sn_regex_ss;
  undefined1 local_2a8 [20];
  Subtype SStack_294;
  char *pcStack_290;
  char *local_288;
  vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *local_280;
  pointer local_278;
  pointer local_270;
  undefined1 local_268 [32];
  _Elt_pointer local_248;
  _Map_pointer ppTStack_240;
  _Elt_pointer local_238;
  _Elt_pointer pTStack_230;
  _Elt_pointer local_228;
  _Map_pointer ppTStack_220;
  uint local_210;
  uint local_20c;
  uint local_208;
  uint local_204;
  uint local_200;
  uint local_1fc;
  Options<char> *local_1f8;
  vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> local_1f0;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_1d8;
  ostream *local_1b8 [2];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_280 = __return_storage_ptr__;
  local_270 = (pointer)size;
  if ((size < 2) || (*formula != '=')) {
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1b8[0] = local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Invalid Excel formula","");
    std::runtime_error::runtime_error(prVar10,(string *)local_1b8);
    *(undefined ***)prVar10 = &PTR__runtime_error_001b7900;
    __cxa_throw(prVar10,&invalid_formula::typeinfo,std::runtime_error::~runtime_error);
  }
  local_204 = 0x7b;
  if ((options->left_brace).super__Optional_base<char,_true,_true>._M_payload.
      super__Optional_payload_base<char>._M_engaged != false) {
    local_204 = (uint)(byte)(options->left_brace).super__Optional_base<char,_true,_true>._M_payload.
                            super__Optional_payload_base<char>._M_payload._M_value;
  }
  local_200 = 0x5b;
  if ((options->left_bracket).super__Optional_base<char,_true,_true>._M_payload.
      super__Optional_payload_base<char>._M_engaged != false) {
    local_200 = (uint)(byte)(options->left_bracket).super__Optional_base<char,_true,_true>.
                            _M_payload.super__Optional_payload_base<char>._M_payload._M_value;
  }
  bVar20 = (options->right_brace).super__Optional_base<char,_true,_true>._M_payload.
           super__Optional_payload_base<char>._M_engaged != false;
  uVar4 = (uint)(byte)(options->right_brace).super__Optional_base<char,_true,_true>._M_payload.
                      super__Optional_payload_base<char>._M_payload._M_value;
  local_20c = 0x7d;
  if (bVar20) {
    local_20c = uVar4;
  }
  local_1fc = 0x5d;
  if (bVar20) {
    local_1fc = uVar4;
  }
  local_210 = 0x2c;
  if ((options->list_separator).super__Optional_base<char,_true,_true>._M_payload.
      super__Optional_payload_base<char>._M_engaged != false) {
    local_210 = (uint)(byte)(options->list_separator).super__Optional_base<char,_true,_true>.
                            _M_payload.super__Optional_payload_base<char>._M_payload._M_value;
  }
  cVar16 = (options->decimal_separator).super__Optional_base<char,_true,_true>._M_payload.
           super__Optional_payload_base<char>._M_payload._M_value;
  bVar20 = (options->decimal_separator).super__Optional_base<char,_true,_true>._M_payload.
           super__Optional_payload_base<char>._M_engaged;
  local_208 = 0x3b;
  if ((options->row_separator).super__Optional_base<char,_true,_true>._M_payload.
      super__Optional_payload_base<char>._M_engaged != false) {
    local_208 = (uint)(byte)(options->row_separator).super__Optional_base<char,_true,_true>.
                            _M_payload.super__Optional_payload_base<char>._M_payload._M_value;
  }
  local_288 = formula;
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"^[1-9](\\",8);
  cVar11 = '.';
  if (bVar20 != false) {
    cVar11 = cVar16;
  }
  local_268[0] = cVar11;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_268,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\\d+)?E[+-]\\d*$",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&local_1d8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268,0x11);
  pvVar1 = local_280;
  pcVar18 = local_288;
  if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
    operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
  }
  (pvVar1->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar1->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar1->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_228 = (_Elt_pointer)0x0;
  ppTStack_220 = (_Map_pointer)0x0;
  local_238 = (_Elt_pointer)0x0;
  pTStack_230 = (_Elt_pointer)0x0;
  local_248 = (_Elt_pointer)0x0;
  ppTStack_240 = (_Map_pointer)0x0;
  local_268._16_8_ = (void *)0x0;
  local_268._24_8_ = 0;
  local_268._0_8_ = (pointer)0x0;
  local_268._8_8_ = 0;
  std::_Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>::
  _M_initialize_map((_Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_> *)
                    local_268,0);
  bVar20 = false;
  pTVar19 = (pointer)0x1;
  bVar22 = false;
  bVar21 = false;
  bVar3 = false;
  pTVar15 = (pointer)0x1;
  local_1f8 = options;
  do {
    cVar16 = pcVar18[(long)pTVar19];
    pTVar14 = pTVar15;
    if (cVar16 == '\0') break;
    pcVar13 = pcVar18 + (long)pTVar19;
    pcVar18 = local_288;
    if (bVar3) {
      if (cVar16 != '\"') {
        bVar3 = true;
        goto LAB_00171d92;
      }
      pTVar2 = (pointer)((long)&pTVar19->m_start + 2);
      if ((local_270 < pTVar2) || (bVar3 = true, pcVar13[1] != '\"')) {
        stack0xfffffffffffffd68 = (pointer)0x300000001;
        local_2a8._0_8_ = pTVar15;
        local_2a8._8_8_ = pTVar19;
        std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
        emplace_back<xlfparser::Token>(local_280,(Token *)local_2a8);
        pTVar14 = (pointer)((long)&pTVar19->m_start + 1);
        bVar3 = false;
        pcVar18 = local_288;
        pTVar2 = pTVar14;
      }
    }
    else {
      if (bVar21) {
        bVar21 = cVar16 != '\'';
        if (((!bVar21) && (pTVar2 = (pointer)((long)&pTVar19->m_start + 2), pTVar2 <= local_270)) &&
           (pcVar13[1] == '\'')) {
          bVar21 = true;
          bVar3 = false;
          goto LAB_00171d9a;
        }
        bVar3 = false;
      }
      else {
        if (!bVar22) {
          if (bVar20) {
            pTVar14 = (pointer)((long)&pTVar19->m_start + 1);
            pcVar18 = local_288 + (long)pTVar15;
            plVar17 = &DAT_001b7818;
            pcVar13 = "#NULL!";
            local_278 = pTVar15;
            do {
              sVar7 = strlen(pcVar13);
              if ((sVar7 == (long)pTVar14 - (long)pTVar15) &&
                 (iVar5 = strncmp(pcVar13,pcVar18,(long)pTVar14 - (long)pTVar15), iVar5 == 0)) {
                local_2a8._0_8_ = local_278;
                stack0xfffffffffffffd68 = (pointer)0x600000001;
                local_2a8._8_8_ = pTVar19;
                std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                emplace_back<xlfparser::Token>(local_280,(Token *)local_2a8);
                bVar3 = false;
                bVar21 = false;
                bVar22 = false;
                bVar20 = false;
                pcVar18 = local_288;
                pTVar2 = pTVar14;
                goto LAB_00171d9a;
              }
              pcVar13 = (char *)*plVar17;
              plVar17 = plVar17 + 1;
            } while (pcVar13 != (char *)0x0);
            bVar20 = true;
LAB_00171e88:
            bVar21 = false;
            bVar22 = false;
            bVar3 = false;
            pcVar18 = local_288;
            pTVar14 = local_278;
            pTVar2 = (pointer)((long)&pTVar19->m_start + 1);
            goto LAB_00171d9a;
          }
          if (pTVar15 < pTVar19) {
            stack0xfffffffffffffd68 = (pointer)0x0;
            pcStack_290 = (char *)0x0;
            local_2a8._0_8_ = (pointer)0x0;
            local_2a8._8_8_ = (pointer)0x0;
            local_278 = pTVar15;
            bVar20 = std::__detail::
                     __regex_algo_impl<char_const*,std::allocator<std::__cxx11::sub_match<char_const*>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                               (local_288 + (long)pTVar15,pcVar13 + 1,
                                (match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                 *)local_2a8,
                                (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_1d8,0
                               );
            if ((pointer)local_2a8._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_2a8._0_8_,
                              (long)stack0xfffffffffffffd68 - local_2a8._0_8_);
            }
            if (bVar20) {
              bVar20 = false;
              goto LAB_00171e88;
            }
            cVar16 = *pcVar13;
            pTVar15 = local_278;
          }
          pvVar1 = local_280;
          if (cVar16 == '\'') {
            if (pTVar15 < pTVar19) {
              local_2a8._8_8_ = (long)&pTVar19[-1].m_subtype + 3;
              stack0xfffffffffffffd68 = (pointer)0x0;
              local_2a8._0_8_ = pTVar15;
              std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
              emplace_back<xlfparser::Token>(local_280,(Token *)local_2a8);
              pTVar15 = pTVar19;
            }
            bVar21 = true;
            bVar3 = false;
LAB_00171fa1:
            bVar20 = false;
          }
          else {
            if (cVar16 == '\"') {
              if (pTVar15 < pTVar19) {
                local_2a8._8_8_ = (long)&pTVar19[-1].m_subtype + 3;
                stack0xfffffffffffffd68 = (pointer)0x0;
                local_2a8._0_8_ = pTVar15;
                std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                emplace_back<xlfparser::Token>(local_280,(Token *)local_2a8);
                pTVar15 = pTVar19;
              }
              bVar3 = true;
LAB_00171f8f:
              bVar21 = false;
              goto LAB_00171fa1;
            }
            if (cVar16 == (char)local_200) {
              bVar22 = true;
              bVar3 = false;
              bVar21 = false;
              bVar20 = false;
              goto LAB_00171d92;
            }
            if (cVar16 != '#') {
              if (cVar16 == (char)local_204) {
                if (pTVar15 < pTVar19) {
                  local_2a8._8_8_ = (long)&pTVar19[-1].m_subtype + 3;
                  stack0xfffffffffffffd68 = (pointer)0x0;
                  local_2a8._0_8_ = pTVar15;
                  std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                  emplace_back<xlfparser::Token>(local_280,(Token *)local_2a8);
                  pTVar15 = pTVar19;
                }
                pcVar18 = local_288;
                stack0xfffffffffffffd68 = (pointer)0x100000003;
                local_2a8._0_8_ = pTVar15;
                local_2a8._8_8_ = pTVar19;
                std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                emplace_back<xlfparser::Token>(pvVar1,(Token *)local_2a8);
                stack0xfffffffffffffd68 = (pointer)0x100000004;
                local_2a8._0_8_ = pTVar15;
                local_2a8._8_8_ = pTVar19;
                std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                emplace_back<xlfparser::Token>(pvVar1,(Token *)local_2a8);
                local_2a8._0_4_ = 3;
                std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>::
                emplace_back<xlfparser::Token::Type>
                          ((deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_> *
                           )local_268,(Type *)local_2a8);
                local_2a8._0_4_ = 4;
                std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>::
                emplace_back<xlfparser::Token::Type>
                          ((deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_> *
                           )local_268,(Type *)local_2a8);
              }
              else {
                if ((cVar16 == (char)local_208) && (local_238 != (_Elt_pointer)local_268._16_8_)) {
                  pTVar9 = local_238;
                  if (local_238 == pTStack_230) {
                    pTVar9 = ppTStack_220[-1] + 0x80;
                  }
                  if (pTVar9[-1] == ArrayRow) {
                    if (pTVar15 < pTVar19) {
                      local_2a8._8_8_ = (long)&pTVar19[-1].m_subtype + 3;
                      stack0xfffffffffffffd68 = (pointer)0x1;
                      local_2a8._0_8_ = pTVar15;
                      std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                      emplace_back<xlfparser::Token>(local_280,(Token *)local_2a8);
                      pTVar15 = pTVar19;
                    }
                    pcVar18 = local_288;
                    pTVar9 = local_238;
                    if (local_238 == pTStack_230) {
                      pTVar9 = ppTStack_220[-1] + 0x80;
                    }
                    stack0xfffffffffffffd68 = (pointer)CONCAT44(Stop,pTVar9[-1]);
                    local_2a8._0_8_ = pTVar15;
                    local_2a8._8_8_ = pTVar19;
                    std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                    emplace_back<xlfparser::Token>(pvVar1,(Token *)local_2a8);
                    if (local_238 == pTStack_230) {
                      operator_delete(pTStack_230,0x200);
                      pTStack_230 = ppTStack_220[-1];
                      local_228 = pTStack_230 + 0x80;
                      local_238 = pTStack_230 + 0x7f;
                      ppTStack_220 = ppTStack_220 + -1;
                    }
                    else {
                      local_238 = local_238 + -1;
                    }
                    stack0xfffffffffffffd68 = (pointer)0x100000004;
                    local_2a8._0_8_ = pTVar15;
                    local_2a8._8_8_ = pTVar19;
                    std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                    emplace_back<xlfparser::Token>(pvVar1,(Token *)local_2a8);
                    local_2a8._0_4_ = 4;
                    std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>::
                    emplace_back<xlfparser::Token::Type>
                              ((deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                                *)local_268,(Type *)local_2a8);
                    goto LAB_001725e3;
                  }
                }
                if (cVar16 == (char)local_20c) {
                  if (pTVar15 < pTVar19) {
                    local_2a8._8_8_ = (long)&pTVar19[-1].m_subtype + 3;
                    stack0xfffffffffffffd68 = (pointer)0x1;
                    local_2a8._0_8_ = pTVar15;
                    std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                    emplace_back<xlfparser::Token>(local_280,(Token *)local_2a8);
                    pTVar15 = pTVar19;
                  }
                  pcVar18 = local_288;
                  if (local_238 == (_Elt_pointer)local_268._16_8_) {
                    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
                    local_2a8._0_8_ = local_2a8 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_2a8,"Mismatched braces","");
                    std::runtime_error::runtime_error(prVar10,(string *)local_2a8);
                    *(undefined ***)prVar10 = &PTR__runtime_error_001b7900;
                    __cxa_throw(prVar10,&invalid_formula::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  pTVar9 = local_238;
                  if (local_238 == pTStack_230) {
                    pTVar9 = ppTStack_220[-1] + 0x80;
                  }
                  stack0xfffffffffffffd68 = (pointer)CONCAT44(Stop,pTVar9[-1]);
                  local_2a8._0_8_ = pTVar15;
                  local_2a8._8_8_ = pTVar19;
                  std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                  emplace_back<xlfparser::Token>(pvVar1,(Token *)local_2a8);
                  if (local_238 == pTStack_230) {
                    operator_delete(pTStack_230,0x200);
                    pTStack_230 = ppTStack_220[-1];
                    local_228 = pTStack_230 + 0x80;
                    pTVar9 = pTStack_230 + 0x7f;
                    local_238 = pTVar9;
                    ppTStack_220 = ppTStack_220 + -1;
                  }
                  else {
                    local_238 = local_238 + -1;
                    pTVar9 = local_238;
                    if (local_238 == pTStack_230) {
                      pTVar9 = ppTStack_220[-1] + 0x80;
                    }
                  }
                  stack0xfffffffffffffd68 = (pointer)CONCAT44(2,pTVar9[-1]);
                  local_2a8._0_8_ = pTVar15;
                  local_2a8._8_8_ = pTVar19;
                  std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                  emplace_back<xlfparser::Token>(pvVar1,(Token *)local_2a8);
LAB_001723ed:
                  if (local_238 == pTStack_230) {
                    operator_delete(pTStack_230,0x200);
                    pTStack_230 = ppTStack_220[-1];
                    local_228 = pTStack_230 + 0x80;
                    local_238 = pTStack_230 + 0x7f;
                    ppTStack_220 = ppTStack_220 + -1;
                  }
                  else {
                    local_238 = local_238 + -1;
                  }
                }
                else {
                  if (cVar16 == ' ') {
                    pcVar18 = local_288;
                    if (pTVar15 < pTVar19) {
                      local_2a8._8_8_ = (long)&pTVar19[-1].m_subtype + 3;
                      stack0xfffffffffffffd68 = (pointer)0x1;
                      local_2a8._0_8_ = pTVar15;
                      std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                      emplace_back<xlfparser::Token>(local_280,(Token *)local_2a8);
                      pcVar18 = local_288;
                      pTVar15 = pTVar19;
                    }
                    do {
                      pTVar14 = pTVar19;
                      if (local_270 <= pTVar14) break;
                      pTVar19 = (pointer)((long)&pTVar14->m_start + 1);
                    } while (pcVar18[(long)pTVar14] == ' ');
                    local_2a8._8_8_ = (long)&pTVar14[-1].m_subtype + 3;
                    stack0xfffffffffffffd68 = (pointer)0xa;
                    local_2a8._0_8_ = pTVar15;
                    std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                    emplace_back<xlfparser::Token>(pvVar1,(Token *)local_2a8);
LAB_00172496:
                    bVar3 = false;
                    bVar21 = false;
                    bVar22 = false;
                    bVar20 = false;
                    pTVar2 = pTVar14;
                    goto LAB_00171d9a;
                  }
                  pTVar14 = (pointer)((long)&pTVar19->m_start + 2);
                  local_278 = pTVar15;
                  if (pTVar14 <= local_270) {
                    ppuVar12 = &PTR_anon_var_dwarf_1dacb6_001b7868;
                    pcVar18 = ">=";
                    do {
                      sVar7 = strlen(pcVar18);
                      if ((sVar7 == 2) &&
                         (iVar5 = strncmp(pcVar18,pcVar13,2), pvVar1 = local_280, iVar5 == 0)) {
                        local_2a8._0_8_ = local_278;
                        if (local_278 < pTVar19) {
                          local_2a8._8_8_ = (long)&pTVar19[-1].m_subtype + 3;
                          stack0xfffffffffffffd68 = (pointer)0x1;
                          std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                          emplace_back<xlfparser::Token>(local_280,(Token *)local_2a8);
                          local_2a8._0_8_ = pTVar19;
                        }
                        pcVar18 = local_288;
                        local_2a8._8_8_ = (long)&pTVar19->m_start + 1;
                        stack0xfffffffffffffd68 = (pointer)0x500000008;
                        std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                        emplace_back<xlfparser::Token>(pvVar1,(Token *)local_2a8);
                        goto LAB_00172496;
                      }
                      pcVar18 = *ppuVar12;
                      ppuVar12 = ppuVar12 + 1;
                    } while (pcVar18 != (char *)0x0);
                  }
                  pvVar1 = local_280;
                  pcVar18 = local_288;
                  cVar11 = '+';
                  lVar8 = 1;
                  do {
                    if (cVar11 == cVar16) {
                      local_2a8._0_8_ = local_278;
                      if (local_278 < pTVar19) {
                        local_2a8._8_8_ = (long)&pTVar19[-1].m_subtype + 3;
                        stack0xfffffffffffffd68 = (pointer)0x1;
                        std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                        emplace_back<xlfparser::Token>(local_280,(Token *)local_2a8);
                        local_2a8._0_8_ = pTVar19;
                      }
                      stack0xfffffffffffffd68 = (pointer)0x8;
                      local_2a8._8_8_ = pTVar19;
                      std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                      emplace_back<xlfparser::Token>(pvVar1,(Token *)local_2a8);
                      goto LAB_001725e3;
                    }
                    cVar11 = "+-*/^&=><@"[lVar8];
                    lVar8 = lVar8 + 1;
                  } while (lVar8 != 0xb);
                  if (cVar16 == '%') {
                    local_2a8._0_8_ = local_278;
                    if (local_278 < pTVar19) {
                      local_2a8._8_8_ = (long)&pTVar19[-1].m_subtype + 3;
                      stack0xfffffffffffffd68 = (pointer)0x1;
                      std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                      emplace_back<xlfparser::Token>(local_280,(Token *)local_2a8);
                      local_2a8._0_8_ = pTVar19;
                    }
                    stack0xfffffffffffffd68 = (pointer)0x9;
                    local_2a8._8_8_ = pTVar19;
                    std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                    emplace_back<xlfparser::Token>(pvVar1,(Token *)local_2a8);
                  }
                  else if (cVar16 == '(') {
                    if (local_278 < pTVar19) {
                      local_2a8._8_8_ = (long)&pTVar19[-1].m_subtype + 3;
                      local_2a8._0_8_ = local_278;
                      stack0xfffffffffffffd68 = (pointer)0x100000002;
                      std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                      emplace_back<xlfparser::Token>(local_280,(Token *)local_2a8);
                      local_2a8._0_4_ = 2;
                      std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>::
                      emplace_back<xlfparser::Token::Type>
                                ((deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                                  *)local_268,(Type *)local_2a8);
                    }
                    else {
                      local_2a8._0_8_ = local_278;
                      stack0xfffffffffffffd68 = (pointer)0x100000005;
                      local_2a8._8_8_ = pTVar19;
                      std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                      emplace_back<xlfparser::Token>(local_280,(Token *)local_2a8);
                      local_2a8._0_4_ = 5;
                      std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>::
                      emplace_back<xlfparser::Token::Type>
                                ((deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                                  *)local_268,(Type *)local_2a8);
                    }
                  }
                  else {
                    if (cVar16 != (char)local_210) {
                      if (cVar16 != ')') {
                        bVar3 = false;
                        pTVar15 = local_278;
                        goto LAB_00171f8f;
                      }
                      pTVar15 = local_278;
                      if (local_278 < pTVar19) {
                        local_2a8._8_8_ = (long)&pTVar19[-1].m_subtype + 3;
                        local_2a8._0_8_ = local_278;
                        stack0xfffffffffffffd68 = (pointer)0x1;
                        std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                        emplace_back<xlfparser::Token>(local_280,(Token *)local_2a8);
                        pTVar15 = pTVar19;
                      }
                      if (local_238 == (_Elt_pointer)local_268._16_8_) {
                        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
                        local_2a8._0_8_ = local_2a8 + 0x10;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_2a8,"Mismatched parentheses","");
                        std::runtime_error::runtime_error(prVar10,(string *)local_2a8);
                        *(undefined ***)prVar10 = &PTR__runtime_error_001b7900;
                        __cxa_throw(prVar10,&invalid_formula::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                      pTVar9 = local_238;
                      if (local_238 == pTStack_230) {
                        pTVar9 = ppTStack_220[-1] + 0x80;
                      }
                      stack0xfffffffffffffd68 = (pointer)CONCAT44(2,pTVar9[-1]);
                      local_2a8._0_8_ = pTVar15;
                      local_2a8._8_8_ = pTVar19;
                      std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                      emplace_back<xlfparser::Token>(pvVar1,(Token *)local_2a8);
                      goto LAB_001723ed;
                    }
                    local_2a8._0_8_ = local_278;
                    if (local_278 < pTVar19) {
                      local_2a8._8_8_ = (long)&pTVar19[-1].m_subtype + 3;
                      stack0xfffffffffffffd68 = (pointer)0x1;
                      std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                      emplace_back<xlfparser::Token>(local_280,(Token *)local_2a8);
                      local_2a8._0_8_ = pTVar19;
                    }
                    if (local_238 == (_Elt_pointer)local_268._16_8_) {
LAB_0017270a:
                      uVar23 = 8;
                      uVar24 = 0xb;
                    }
                    else {
                      pTVar9 = local_238;
                      if (local_238 == pTStack_230) {
                        pTVar9 = ppTStack_220[-1] + 0x80;
                      }
                      uVar23 = 6;
                      uVar24 = 0;
                      if (pTVar9[-1] != Function) goto LAB_0017270a;
                    }
                    unique0x10000291 = (pointer)CONCAT44(uVar24,uVar23);
                    local_2a8._8_8_ = pTVar19;
                    std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                    emplace_back<xlfparser::Token>(pvVar1,(Token *)local_2a8);
                  }
                }
              }
LAB_001725e3:
              pTVar14 = (pointer)((long)&pTVar19->m_start + 1);
              bVar3 = false;
              bVar21 = false;
              bVar22 = false;
              bVar20 = false;
              pTVar2 = pTVar14;
              goto LAB_00171d9a;
            }
            if (pTVar15 < pTVar19) {
              local_2a8._8_8_ = (long)&pTVar19[-1].m_subtype + 3;
              stack0xfffffffffffffd68 = (pointer)0x0;
              local_2a8._0_8_ = pTVar15;
              std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
              emplace_back<xlfparser::Token>(local_280,(Token *)local_2a8);
              pTVar15 = pTVar19;
            }
            bVar20 = true;
            bVar3 = false;
            bVar21 = false;
          }
          bVar22 = false;
          pcVar18 = local_288;
          pTVar14 = pTVar15;
          pTVar2 = (pointer)((long)&pTVar19->m_start + 1);
          goto LAB_00171d9a;
        }
        bVar22 = cVar16 != (char)local_1fc;
        bVar3 = false;
        bVar21 = false;
      }
LAB_00171d92:
      pcVar18 = local_288;
      pTVar14 = pTVar15;
      pTVar2 = (pointer)((long)&pTVar19->m_start + 1);
    }
LAB_00171d9a:
    pTVar19 = pTVar2;
    pTVar15 = pTVar14;
  } while (pTVar19 < local_270);
  pvVar1 = local_280;
  if ((pTVar14 < pTVar19) &&
     ((pTVar15 = (local_280->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>
                 )._M_impl.super__Vector_impl_data._M_finish,
      (local_280->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>)._M_impl.
      super__Vector_impl_data._M_start == pTVar15 || ((pointer)pTVar15[-1].m_end < pTVar14)))) {
    local_2a8._8_8_ = (long)&pTVar19[-1].m_subtype + 3;
    stack0xfffffffffffffd68 = (pointer)0x1;
    local_2a8._0_8_ = pTVar14;
    std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::emplace_back<xlfparser::Token>
              (local_280,(Token *)local_2a8);
  }
  std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::vector(&local_1f0,pvVar1);
  _fix_whitespace_tokens<char>
            ((vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *)local_2a8,&local_1f0,
             pcVar18,(size_t)local_270);
  options_00 = local_1f8;
  pTVar15 = (pvVar1->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pTVar19 = (pvVar1->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage;
  (pvVar1->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_2a8._0_8_;
  (pvVar1->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_2a8._8_8_;
  (pvVar1->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = stack0xfffffffffffffd68;
  local_2a8._0_8_ = (pointer)0x0;
  local_2a8._8_8_ = (pointer)0x0;
  stack0xfffffffffffffd68 = (pointer)0x0;
  if ((pTVar15 != (pointer)0x0) &&
     (operator_delete(pTVar15,(long)pTVar19 - (long)pTVar15),
     (pointer)local_2a8._0_8_ != (pointer)0x0)) {
    operator_delete((void *)local_2a8._0_8_,(long)stack0xfffffffffffffd68 - local_2a8._0_8_);
  }
  if (local_1f0.super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f0.
                    super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f0.
                          super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f0.
                          super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  _infer_token_subtypes<char>(pvVar1,options_00,pcVar18,(size_t)local_270);
  std::_Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>::~_Deque_base
            ((_Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_> *)
             local_268);
  Catch::clara::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            (&local_1d8);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  return pvVar1;
}

Assistant:

inline std::vector<Token> tokenize(const char_type *formula, size_t size, const Options<char_type>& options)
    {
        // Basic checks to make sure it's a valid formula
        if (size < 2 || formula[0] != '=')
            throw invalid_formula("Invalid Excel formula");

        // Chars used in parsing excel formual
        const char_type QUOTE_DOUBLE  = XLFP_CHAR('"');
        const char_type QUOTE_SINGLE  = XLFP_CHAR('\'');
        const char_type PAREN_OPEN    = XLFP_CHAR('(');
        const char_type PAREN_CLOSE   = XLFP_CHAR(')');
        const char_type WHITESPACE    = XLFP_CHAR(' ');
        const char_type ERROR_START   = XLFP_CHAR('#');

        // Some chars can be changed in the options
        const auto left_brace = options.left_brace.value_or(XLFP_CHAR('{'));
        const auto right_brace = options.right_brace.value_or(XLFP_CHAR('}'));
        const auto left_bracket = options.left_bracket.value_or(XLFP_CHAR('['));
        const auto right_bracket = options.right_brace.value_or(XLFP_CHAR(']'));
        const auto list_separator = options.list_separator.value_or(XLFP_CHAR(','));
        const auto decimal_separator = options.decimal_separator.value_or(XLFP_CHAR('.'));
        const auto row_separator = options.row_separator.value_or(XLFP_CHAR(';'));

        const char_type* OPERATORS_INFIX   = XLFP_STRING("+-*/^&=><@");
        const char_type* OPERATORS_POSTFIX = XLFP_STRING("%");

        // This matches a number in scientific notation with or without numbers after the + or -.
        // It's used to test for SN numbers before checking for +/- operators.
        std::basic_stringstream<char_type> sn_regex_ss;
        sn_regex_ss << R"(^[1-9](\)" << decimal_separator << R"(\d+)?E[+-]\d*$)";
        const std::basic_regex<char_type> sn_regex(sn_regex_ss.str(),
            std::regex_constants::ECMAScript |
            std::regex_constants::icase);

        const char_type* ERRORS[] = {
                XLFP_STRING("#NULL!"),
                XLFP_STRING("#DIV/0!"),
                XLFP_STRING("#VALUE!"),
                XLFP_STRING("#REF!"),
                XLFP_STRING("#NAME?"),
                XLFP_STRING("#NUM!"),
                XLFP_STRING("#N/A"),
                XLFP_STRING("#SPILL!"),
                NULL
        };

        const char_type* COMPARATORS_MULTI[] = {
                XLFP_STRING(">="),
                XLFP_STRING("<="),
                XLFP_STRING("<>"),
                NULL
        };

        bool in_string = false;
        bool in_path = false;
        bool in_range = false;
        bool in_error = false;

        std::vector<Token> tokens;
        std::stack<Token::Type> stack;

        size_t index = 1;  // first char is always '='
        size_t start = index;  // start of the current token
        while(index < size && formula[index] != L'\0')
        {
            // state-dependent character evaluation (order is important)

            // double-quoted strings
            // embeds are doubled
            // end marks token
            if (in_string) {
                if (formula[index] == QUOTE_DOUBLE)
                {
                    if (((index + 2) <= size) && (formula[index + 1] == QUOTE_DOUBLE))
                    {
                        // '""' is a quoted '"' so skip both
                        index += 2;
                        continue;
                    }

                    // add the string token, exit the string and continue
                    tokens.push_back(Token(start, index, Token::Type::Operand, Token::Subtype::Text));
                    start = ++index;
                    in_string = false;
                    continue;
                }

                ++index;
                continue;
            }

            // single-quoted strings (links)
            // embeds are double
            // end does not mark a token
            if (in_path)
            {
                if (formula[index] == QUOTE_SINGLE)
                {
                    if (((index + 2) <= size) && (formula[index + 1] == QUOTE_SINGLE))
                    {
                        // '' is a quoted ' so skip both
                        index += 2;
                        continue;
                    }

                    in_path = false;
                }

                ++index;
                continue;
            }

            // bracketed strings (R1C1 range index or linked workbook name)
            // no embeds (changed to "()" by Excel)
            // end does not mark a token
            if (in_range)
            {
                if (formula[index] == right_bracket)
                    in_range = false;

                index++;
                continue;
            }

            // error values
            // end marks a token, determined from absolute list of values
            if (in_error)
            {
                for (auto err = &ERRORS[0]; *err != NULL; ++err)
                {
                    if (_str_equals(*err, _tcslen(*err), &formula[start], 1 + index - start))
                    {
                        // add the string token, exit the string and continue
                        tokens.push_back(Token(start, index, Token::Type::Operand, Token::Subtype::Error));
                        start = index + 1;
                        in_error = false;
                        break;
                    }
                }

                ++index;
                continue;
            }

            // scientific notation check
            if (index > start)
            {
                if (std::regex_match(&formula[start], &formula[index]+1, sn_regex))
                {
                    ++index;
                    continue;
                }
            }

            // independent character evaluation (order not important)
            // establish state-dependent character evaluations
            if (formula[index] == QUOTE_DOUBLE) {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Unknown, Token::Subtype::None));
                    start = index;
                }

                in_string = true;
                ++index;
                continue;
            }

            if (formula[index] == QUOTE_SINGLE)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Unknown, Token::Subtype::None));
                    start = index;
                }

                in_path = true;
                ++index;
                continue;
            }

            if (formula[index] == left_bracket)
            {
                in_range = true;
                ++index;
                continue;
            }

            if (formula[index] == ERROR_START)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Unknown, Token::Subtype::None));
                    start = index;
                }

                in_error = true;
                ++index;
                continue;
            }

            // mark start and end of arrays and array rows
            if (formula[index] == left_brace)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Unknown, Token::Subtype::None));
                    start = index;
                }

                tokens.push_back(Token(start, index, Token::Type::Array, Token::Subtype::Start));
                tokens.push_back(Token(start, index, Token::Type::ArrayRow, Token::Subtype::Start));

                stack.push(Token::Type::Array);
                stack.push(Token::Type::ArrayRow);

                start = ++index;
                continue;
            }

            if (formula[index] == row_separator && !stack.empty() && stack.top() == Token::Type::ArrayRow)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                    start = index;
                }

                tokens.push_back(Token(start, index, stack.top(), Token::Subtype::Stop));
                stack.pop();

                tokens.push_back(Token(start, index, Token::Type::ArrayRow, Token::Subtype::Start));
                stack.push(Token::Type::ArrayRow);

                start = ++index;
                continue;
            }

            if (formula[index] == right_brace)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                    start = index;
                }

                if (stack.empty())
                    throw invalid_formula("Mismatched braces");

                tokens.push_back(Token(start, index, stack.top(), Token::Subtype::Stop));
                stack.pop();

                tokens.push_back(Token(start, index, stack.top(), Token::Subtype::Stop));
                stack.pop();

                start = ++index;
                continue;
            }

            // trim white-space
            if (formula[index] == WHITESPACE)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                    start = index;
                }

                while ((formula[index] == WHITESPACE) && (index < size))
                    index++;

                tokens.push_back(Token(start, index-1, Token::Type::Whitespace, Token::Subtype::None));

                start = index;
                continue;
            }

            // multi-character comparators
            if ((index + 2) <= size)
            {
                bool foundOp = false;
                for (auto op = &COMPARATORS_MULTI[0]; *op != NULL; ++op)
                {
                    if (_str_equals(*op, _tcslen(*op), &formula[index], 2))
                    {
                        if (index > start)
                        {
                            tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                            start = index;
                        }

                        tokens.push_back(Token(start, index+1, Token::Type::OperatorInfix, Token::Subtype::Logical));
                        foundOp = true;
                        break;
                    }
                }

                if (foundOp)
                {
                    index += 2;
                    start = index;
                    continue;
                }
            }

            // standard infix operators
            bool foundOp = false;
            for (auto op = OPERATORS_INFIX; *op != L'\0'; ++op)
            {
                if (*op == formula[index])
                {
                    if (index > start)
                    {
                        tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                        start = index;
                    }

                    tokens.push_back(Token(start, index, Token::Type::OperatorInfix, Token::Subtype::None));
                    foundOp = true;
                    break;
                }
            }

            if (foundOp)
            {
                start = ++index;
                continue;
            }

            // standard postfix operators
            for (auto op = OPERATORS_POSTFIX; *op != L'\0'; ++op)
            {
                if (*op == formula[index])
                {
                    if (index > start)
                    {
                        tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                        start = index;
                    }

                    tokens.push_back(Token(start, index, Token::Type::OperatorPostfix, Token::Subtype::None));
                    foundOp = true;
                    break;
                }
            }

            if (foundOp)
            {
                start = ++index;
                continue;
            }

            // start subexpression or function
            if (formula[index] == PAREN_OPEN)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Function, Token::Subtype::Start));
                    stack.push(Token::Type::Function);
                }
                else
                {
                    tokens.push_back(Token(start, index, Token::Type::Subexpression, Token::Subtype::Start));
                    stack.push(Token::Type::Subexpression);
                }

                start = ++index;
                continue;
            }

            // function, subexpression, or array parameters, or operand unions
            if (formula[index] == list_separator)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                    start = index;
                }

                auto type = (!stack.empty() && stack.top() == Token::Type::Function)
                                ? std::make_tuple(Token::Type::Argument, Token::Subtype::None)
                                : std::make_tuple(Token::Type::OperatorInfix, Token::Subtype::Union);

                tokens.push_back(Token(start, index, std::get<0>(type), std::get<1>(type)));

                start = ++index;
                continue;
            }

            // stop subexpression
            if (formula[index] == PAREN_CLOSE)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                    start = index;
                }

                if (stack.empty())
                    throw invalid_formula("Mismatched parentheses");

                tokens.push_back(Token(start, index, stack.top(), Token::Subtype::Stop));
                stack.pop();

                start = ++index;
                continue;
            }

            // token accumulation
            ++index;
        }

        // dump remaining accumulation, if any
        if (index > start && (tokens.empty() || tokens.back().end() < start))
            tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));

        // label intersection operators specified as whitespace correctly
        tokens = _fix_whitespace_tokens(tokens, formula, size);

        // set the token subtypes correctly
        _infer_token_subtypes(tokens, options, formula, size);

        return tokens;
    }